

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.c
# Opt level: O0

void testing_run_(testing_base tb,_func_void_testing *f,char *name,int is_benchmark)

{
  int iVar1;
  closure_t_testing_0 a0;
  FILE *pFVar2;
  nsync_dll_list_ pnVar3;
  closure *pcVar4;
  testing t;
  int exit_status;
  int is_benchmark_local;
  char *name_local;
  _func_void_testing *f_local;
  testing_base tb_local;
  
  nsync::nsync_mu_lock(&tb->testing_mu);
  iVar1 = tb->exit_status;
  nsync::nsync_mu_unlock(&tb->testing_mu);
  if ((((iVar1 < 2) && ((is_benchmark == 0 || (tb->run_benchmarks != 0)))) &&
      ((is_benchmark != 0 || (tb->run_tests != 0)))) &&
     (((tb->include_pat == (char *)0x0 || (iVar1 = match(tb->include_pat,name), iVar1 != 0)) &&
      ((tb->exclude_pat == (char *)0x0 || (iVar1 = match(tb->exclude_pat,name), iVar1 == 0)))))) {
    a0 = (closure_t_testing_0)malloc(0x68);
    memset(a0,0,0x68);
    nsync::nsync_dll_init_(&a0->siblings,a0);
    a0->base = tb;
    a0->f = f;
    a0->name = name;
    if (tb->parallelism == 1) {
      a0->fp = tb->fp;
    }
    else {
      pFVar2 = tmpfile();
      a0->fp = (FILE *)pFVar2;
    }
    if (is_benchmark == 0) {
      if (tb->benchmarks_running != 0) {
        nsync::nsync_mu_lock(&tb->testing_mu);
        nsync::nsync_mu_wait
                  (&tb->testing_mu,int_is_zero,&tb->child_count,(_func_int_void_ptr_void_ptr *)0x0);
        nsync::nsync_mu_unlock(&tb->testing_mu);
        tb->benchmarks_running = 0;
      }
      nsync::nsync_mu_lock(&tb->testing_mu);
      nsync::nsync_mu_wait(&tb->testing_mu,spare_thread,tb,(_func_int_void_ptr_void_ptr *)0x0);
      tb->child_count = tb->child_count + 1;
      pnVar3 = nsync::nsync_dll_make_last_in_list_(tb->children,&a0->siblings);
      tb->children = pnVar3;
      nsync::nsync_mu_unlock(&tb->testing_mu);
      pcVar4 = closure_testing(run_test,a0);
      closure_fork(pcVar4);
    }
    else {
      if (tb->benchmarks_running == 0) {
        nsync::nsync_mu_lock(&tb->testing_mu);
        nsync::nsync_mu_wait
                  (&tb->testing_mu,int_is_zero,&tb->child_count,(_func_int_void_ptr_void_ptr *)0x0);
        nsync::nsync_mu_unlock(&tb->testing_mu);
        if (tb->suppress_header == 0) {
          output_header(tb->fp,tb->prog);
        }
        tb->benchmarks_running = 1;
      }
      nsync::nsync_mu_lock(&tb->testing_mu);
      nsync::nsync_mu_wait(&tb->testing_mu,spare_thread,tb,(_func_int_void_ptr_void_ptr *)0x0);
      tb->child_count = tb->child_count + 1;
      pnVar3 = nsync::nsync_dll_make_last_in_list_(tb->children,&a0->siblings);
      tb->children = pnVar3;
      nsync::nsync_mu_unlock(&tb->testing_mu);
      pcVar4 = closure_testing(run_benchmark,a0);
      closure_fork(pcVar4);
    }
  }
  return;
}

Assistant:

void testing_run_ (testing_base tb, void (*f) (testing t), const char *name, int is_benchmark) {
	int exit_status;
	nsync_mu_lock (&tb->testing_mu);
	exit_status = tb->exit_status;
	nsync_mu_unlock (&tb->testing_mu);
	if (exit_status < 2 &&
	    (!is_benchmark || tb->run_benchmarks) &&
	    (is_benchmark || tb->run_tests) &&
	    (tb->include_pat == NULL || match (tb->include_pat, name)) &&
	    (tb->exclude_pat == NULL || !match (tb->exclude_pat, name))) {
		testing t = (testing) malloc (sizeof (*t));
		memset ((void *) t, 0, sizeof (*t));
		nsync_dll_init_ (&t->siblings, t);
		t->base = tb;
		t->f = f;
		t->name = name;
		if (tb->parallelism == 1) {
			t->fp = tb->fp;
		} else {
			t->fp = tmpfile ();
		}
		if (!is_benchmark) {
			if (tb->benchmarks_running) {
				nsync_mu_lock (&tb->testing_mu);
				nsync_mu_wait (&tb->testing_mu, &int_is_zero, &tb->child_count, NULL);
				nsync_mu_unlock (&tb->testing_mu);
				tb->benchmarks_running = 0;
			}
			nsync_mu_lock (&tb->testing_mu);
			nsync_mu_wait (&tb->testing_mu, &spare_thread, tb, NULL);
			tb->child_count++;
			tb->children = nsync_dll_make_last_in_list_ (tb->children, &t->siblings);
			nsync_mu_unlock (&tb->testing_mu);
			closure_fork (closure_testing (&run_test, t));
		} else {
			if (!tb->benchmarks_running) {
				nsync_mu_lock (&tb->testing_mu);
				nsync_mu_wait (&tb->testing_mu, &int_is_zero, &tb->child_count, NULL);
				nsync_mu_unlock (&tb->testing_mu);
				if (!tb->suppress_header) {
					output_header (tb->fp, tb->prog);
				}
				tb->benchmarks_running = 1;
			}
			nsync_mu_lock (&tb->testing_mu);
			nsync_mu_wait (&tb->testing_mu, &spare_thread, tb, NULL);
			tb->child_count++;
			tb->children = nsync_dll_make_last_in_list_ (tb->children, &t->siblings);
			nsync_mu_unlock (&tb->testing_mu);
			closure_fork (closure_testing (&run_benchmark, t));
		}
	}
}